

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O3

void __thiscall
flow::TargetCodeGenerator::visit(TargetCodeGenerator *this,HandlerCallInstr *handlerCallInstr)

{
  pointer ppVVar1;
  size_t sVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  ppVVar1 = (handlerCallInstr->super_Instr).operands_.
            super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar3 = (ulong)((long)(handlerCallInstr->super_Instr).operands_.
                        super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppVVar1) >> 3;
  iVar4 = (int)uVar3 + -1;
  if (0 < iVar4) {
    uVar5 = 1;
    do {
      emitLoad(this,(handlerCallInstr->super_Instr).operands_.
                    super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar5]);
      uVar5 = uVar5 + 1;
    } while ((uVar3 & 0xffffffff) != uVar5);
    ppVVar1 = (handlerCallInstr->super_Instr).operands_.
              super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  sVar2 = ConstantPool::makeNativeHandler(&this->cp_,(IRBuiltinHandler *)*ppVVar1);
  emitInstr(this,HANDLER,(Operand)sVar2,
            (short)((uint)(*(int *)&(handlerCallInstr->super_Instr).operands_.
                                    super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(handlerCallInstr->super_Instr).operands_.
                                   super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
  if (iVar4 != 0) {
    pop(this,(long)iVar4);
    return;
  }
  return;
}

Assistant:

void TargetCodeGenerator::visit(HandlerCallInstr& handlerCallInstr) {
  int argc = handlerCallInstr.operands().size() - 1;
  for (int i = 1; i <= argc; ++i)
    emitLoad(handlerCallInstr.operand(i));

  emitInstr(Opcode::HANDLER,
      cp_.makeNativeHandler(handlerCallInstr.callee()),
      handlerCallInstr.operands().size() - 1);

  if (argc)
    pop(argc);
}